

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  bool *table;
  char *pcVar1;
  StringPiece characters_wanted;
  size_type local_150;
  stringpiece_ssize_type i;
  byte local_138 [8];
  bool lookup [256];
  size_type pos_local;
  StringPiece *this_local;
  StringPiece s_local;
  
  pcVar1 = (char *)s.length_;
  if (this->length_ < 1) {
    s_local.length_ = -1;
  }
  else if ((long)pcVar1 < 1) {
    s_local.length_ = 0;
  }
  else if (pcVar1 == (char *)0x1) {
    s_local.length_ = find_first_not_of(this,(char)*(protobuf *)s.ptr_,pos);
  }
  else {
    table = (bool *)pos;
    memset(local_138,0,0x100);
    characters_wanted.length_ = (stringpiece_ssize_type)local_138;
    characters_wanted.ptr_ = pcVar1;
    BuildLookupTable((protobuf *)s.ptr_,characters_wanted,table);
    for (local_150 = pos; (long)local_150 < this->length_; local_150 = local_150 + 1) {
      if ((local_138[(byte)this->ptr_[local_150]] & 1) == 0) {
        return local_150;
      }
    }
    s_local.length_ = -1;
  }
  return s_local.length_;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_not_of(StringPiece s,
                                                      size_type pos) const {
  if (length_ <= 0) return npos;
  if (s.length_ <= 0) return 0;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i = pos; i < length_; ++i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}